

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O2

int Hsh_IntManHash(uint *pData,int nSize,int nTableSize)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)(nSize << 2);
  if (nSize << 2 < 1) {
    uVar1 = uVar2;
  }
  uVar3 = 0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    uVar3 = uVar3 + (uint)*(byte *)((long)pData + uVar2) * Hsh_IntManHash::s_Primes[uVar2 % 7];
  }
  return uVar3 % (uint)nTableSize;
}

Assistant:

static inline int Hsh_IntManHash( unsigned * pData, int nSize, int nTableSize )
{
    static int s_Primes[7] = { 4177, 5147, 5647, 6343, 7103, 7873, 8147 };
    unsigned char * pDataC = (unsigned char *)pData;
    int c, nChars = nSize * 4;
    unsigned Key = 0;
    for ( c = 0; c < nChars; c++ )
        Key += pDataC[c] * s_Primes[c % 7];
    return (int)(Key % nTableSize);
}